

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_bKGD(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  undefined1 local_30 [8];
  png_color_16 background;
  png_byte buf [6];
  uint truelen;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if (((png_ptr->mode & 4) == 0) && ((png_ptr->color_type != '\x03' || ((png_ptr->mode & 2) != 0))))
  {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x20) == 0)) {
      if (png_ptr->color_type == '\x03') {
        stack0xffffffffffffffe0 = 1;
      }
      else if ((png_ptr->color_type & 2) == 0) {
        stack0xffffffffffffffe0 = 2;
      }
      else {
        stack0xffffffffffffffe0 = 6;
      }
      if (length == stack0xffffffffffffffe0) {
        png_crc_read(png_ptr,(png_bytep)&background.red,stack0xffffffffffffffe0);
        iVar1 = png_crc_finish(png_ptr,0);
        if (iVar1 == 0) {
          if (png_ptr->color_type == '\x03') {
            local_30[0] = (byte)background.red;
            if ((info_ptr == (png_inforp)0x0) || (info_ptr->num_palette == 0)) {
              local_30._6_2_ = 0;
              local_30._4_2_ = 0;
              local_30._2_2_ = 0;
            }
            else {
              if (info_ptr->num_palette <= (ushort)(byte)background.red) {
                png_chunk_benign_error(png_ptr,"invalid index");
                return;
              }
              local_30._2_2_ = ZEXT12(png_ptr->palette[(byte)background.red].red);
              local_30._4_2_ = ZEXT12(png_ptr->palette[(byte)background.red].green);
              local_30._6_2_ = ZEXT12(png_ptr->palette[(byte)background.red].blue);
            }
            background.index = '\0';
            background._1_1_ = 0;
          }
          else {
            if ((png_ptr->color_type & 2) == 0) {
              local_30._2_2_ = (ushort)(byte)background.red * 0x100 + (ushort)background.red._1_1_;
              local_30._4_2_ = local_30._2_2_;
              local_30._6_2_ = local_30._2_2_;
              background._0_2_ = local_30._2_2_;
            }
            else {
              local_30._2_2_ = (ushort)(byte)background.red * 0x100 + (ushort)background.red._1_1_;
              local_30._4_2_ =
                   (ushort)(byte)background.green * 0x100 + (ushort)background.green._1_1_;
              local_30._6_2_ = (ushort)(byte)background.blue * 0x100 + (ushort)background.blue._1_1_
              ;
              background.index = '\0';
              background._1_1_ = 0;
            }
            local_30[0] = 0;
          }
          png_set_bKGD(png_ptr,info_ptr,(png_const_color_16p)local_30);
        }
      }
      else {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error(png_ptr,"invalid");
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"duplicate");
    }
  }
  else {
    png_crc_finish(png_ptr,length);
    png_chunk_benign_error(png_ptr,"out of place");
  }
  return;
}

Assistant:

void /* PRIVATE */
png_handle_bKGD(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int truelen;
   png_byte buf[6];
   png_color_16 background;

   png_debug(1, "in png_handle_bKGD");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0 ||
       (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE &&
       (png_ptr->mode & PNG_HAVE_PLTE) == 0))
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_bKGD) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      truelen = 1;

   else if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
      truelen = 6;

   else
      truelen = 2;

   if (length != truelen)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, truelen);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* We convert the index value into RGB components so that we can allow
    * arbitrary RGB values for background when we have transparency, and
    * so it is easy to determine the RGB values of the background color
    * from the info_ptr struct.
    */
   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
   {
      background.index = buf[0];

      if (info_ptr != NULL && info_ptr->num_palette != 0)
      {
         if (buf[0] >= info_ptr->num_palette)
         {
            png_chunk_benign_error(png_ptr, "invalid index");
            return;
         }

         background.red = (png_uint_16)png_ptr->palette[buf[0]].red;
         background.green = (png_uint_16)png_ptr->palette[buf[0]].green;
         background.blue = (png_uint_16)png_ptr->palette[buf[0]].blue;
      }

      else
         background.red = background.green = background.blue = 0;

      background.gray = 0;
   }

   else if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) == 0) /* GRAY */
   {
      background.index = 0;
      background.red =
      background.green =
      background.blue =
      background.gray = png_get_uint_16(buf);
   }

   else
   {
      background.index = 0;
      background.red = png_get_uint_16(buf);
      background.green = png_get_uint_16(buf + 2);
      background.blue = png_get_uint_16(buf + 4);
      background.gray = 0;
   }

   png_set_bKGD(png_ptr, info_ptr, &background);
}